

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smfdur.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  string *psVar5;
  ostream *poVar6;
  char *pcVar7;
  undefined1 uVar8;
  undefined7 in_register_00000009;
  void *__buf;
  void *__buf_00;
  uint uVar9;
  double seconds;
  MidiFile midifile;
  double local_d8;
  string local_c0;
  MidiFile local_a0;
  
  checkOptions(&options,argc,argv);
  std::__cxx11::string::string((string *)&local_a0,"filename",(allocator *)&local_c0);
  bVar1 = smf::Options::getBoolean(&options,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,"minute",(allocator *)&local_c0);
  bVar2 = smf::Options::getBoolean(&options,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  smf::MidiFile::MidiFile(&local_a0);
  iVar3 = smf::Options::getArgCount(&options);
  local_d8 = 0.0;
  for (uVar9 = 0; uVar8 = uVar9 == 0 || (int)uVar9 < iVar3, uVar9 == 0 || (int)uVar9 < iVar3;
      uVar9 = uVar9 + 1) {
    smf::MidiFile::clear(&local_a0);
    iVar4 = smf::Options::getArgCount(&options);
    if (iVar4 < 1) {
      smf::MidiFile::read(&local_a0,0x12c278,__buf,CONCAT71(in_register_00000009,uVar8));
    }
    else {
      psVar5 = smf::Options::getArg_abi_cxx11_(&options,uVar9 + 1);
      smf::MidiFile::read(&local_a0,(int)psVar5,__buf_00,CONCAT71(in_register_00000009,uVar8));
    }
    iVar4 = smf::Options::getArgCount(&options);
    if (1 < iVar4) {
      psVar5 = smf::Options::getArg_abi_cxx11_(&options,uVar9 + 1);
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)psVar5);
      std::operator<<(poVar6,"\t");
    }
    seconds = getTotalDuration(&local_a0);
    std::ostream::_M_insert<double>(seconds);
    if (bVar2) {
      poVar6 = std::operator<<((ostream *)&std::cout,"\t");
      minutes_abi_cxx11_(&local_c0,seconds);
      std::operator<<(poVar6,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"\t");
      pcVar7 = smf::MidiFile::getFilename(&local_a0);
      std::operator<<((ostream *)&std::cout,pcVar7);
    }
    local_d8 = local_d8 + seconds;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  if (1 < uVar9) {
    std::operator<<((ostream *)&std::cout,"TOTAL\t");
    std::ostream::_M_insert<double>(local_d8);
    if (bVar2) {
      poVar6 = std::operator<<((ostream *)&std::cout,"\t");
      minutes_abi_cxx11_(&local_c0,local_d8);
      std::operator<<(poVar6,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"AVERAGE\t");
    std::ostream::_M_insert<double>(local_d8 / (double)(int)uVar9);
    if (bVar2) {
      poVar6 = std::operator<<((ostream *)&std::cout,"\t");
      minutes_abi_cxx11_(&local_c0,local_d8 / (double)(int)uVar9);
      std::operator<<(poVar6,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  smf::MidiFile::~MidiFile(&local_a0);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
   checkOptions(options, argc, argv);
	int fileQ  = options.getBoolean("filename");
	int minuteQ = options.getBoolean("minute");

   MidiFile midifile;

	int counter = 0;
	double sum = 0.0;
   int numinputs = options.getArgCount();
   for (int i=0; i < numinputs || i==0; i++) {
      midifile.clear();
      if (options.getArgCount() < 1) {
         midifile.read(cin);
      } else {
         midifile.read(options.getArg(i+1));
      }
      if (options.getArgCount() > 1) {
         cout << options.getArg(i+1) << "\t";
      }
		double duration = getTotalDuration(midifile);
		sum += duration;
		counter++;
      cout << duration;
		if (minuteQ) {
			cout << "\t" << minutes(duration);
		}
		if (fileQ) {
			cout << "\t";
			cout << midifile.getFilename();
		}
      cout << endl;
   }
	if (counter > 1) {
		cout << "TOTAL\t" << sum;
		if (minuteQ) {
			cout << "\t" << minutes(sum);
		}
		cout << endl;
		cout << "AVERAGE\t" << sum/counter;
		if (minuteQ) {
			cout << "\t" << minutes(sum/counter);
		}
		cout << endl;
	}
}